

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void CalcResizePosSizeFromAnyCorner
               (ImGuiWindow *window,ImVec2 *corner_target,ImVec2 *corner_norm,ImVec2 *out_pos,
               ImVec2 *out_size)

{
  ImVec2 IVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ImVec2 size_expected;
  ImVec2 local_30;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  auVar4._0_8_ = ImLerp(corner_target,&window->Pos,corner_norm);
  auVar4._8_56_ = extraout_var;
  auVar3 = auVar4._0_16_;
  auVar8._0_4_ = (window->Pos).x + (window->Size).x;
  auVar8._4_4_ = (window->Pos).y + (window->Size).y;
  auVar8._8_8_ = 0;
  auVar6._8_8_ = 0;
  auVar6._0_4_ = corner_target->x;
  auVar6._4_4_ = corner_target->y;
  auVar6 = vsubps_avx(auVar6,auVar8);
  auVar7._0_4_ = auVar6._0_4_ * (*corner_norm).x + auVar8._0_4_;
  auVar7._4_4_ = auVar6._4_4_ * (*corner_norm).y + auVar8._4_4_;
  auVar7._8_4_ = auVar6._8_4_ * 0.0 + 0.0;
  auVar7._12_4_ = auVar6._12_4_ * 0.0 + 0.0;
  auVar6 = vsubps_avx(auVar7,auVar3);
  local_30 = (ImVec2)vmovlps_avx(auVar6);
  auVar5._0_8_ = CalcWindowSizeAfterConstraint(window,&local_30);
  auVar5._8_56_ = extraout_var_00;
  IVar1 = (ImVec2)vmovlps_avx(auVar3);
  *out_pos = IVar1;
  if ((corner_norm->x == 0.0) && (!NAN(corner_norm->x))) {
    out_pos->x = auVar4._0_4_ - (auVar5._0_4_ - auVar6._0_4_);
  }
  if ((corner_norm->y == 0.0) && (!NAN(corner_norm->y))) {
    auVar6 = vsubps_avx(auVar5._0_16_,auVar6);
    auVar6 = vsubps_avx(auVar3,auVar6);
    fVar2 = (float)vextractps_avx(auVar6,1);
    out_pos->y = fVar2;
  }
  IVar1 = (ImVec2)vmovlps_avx(auVar5._0_16_);
  *out_size = IVar1;
  return;
}

Assistant:

static void CalcResizePosSizeFromAnyCorner(ImGuiWindow* window, const ImVec2& corner_target, const ImVec2& corner_norm, ImVec2* out_pos, ImVec2* out_size)
{
    ImVec2 pos_min = ImLerp(corner_target, window->Pos, corner_norm);                // Expected window upper-left
    ImVec2 pos_max = ImLerp(window->Pos + window->Size, corner_target, corner_norm); // Expected window lower-right
    ImVec2 size_expected = pos_max - pos_min;
    ImVec2 size_constrained = CalcWindowSizeAfterConstraint(window, size_expected);
    *out_pos = pos_min;
    if (corner_norm.x == 0.0f)
        out_pos->x -= (size_constrained.x - size_expected.x);
    if (corner_norm.y == 0.0f)
        out_pos->y -= (size_constrained.y - size_expected.y);
    *out_size = size_constrained;
}